

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.c
# Opt level: O0

int gb_load_rom(GameboyRom *rom,char *path)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  size_t sVar3;
  uint8_t *puVar4;
  FILE *rom_file;
  char *path_local;
  GameboyRom *rom_local;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    printf("ERROR\tOpening file\t%s\n",pcVar2);
    rom_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    rom->size = sVar3;
    fseek(__stream,0,0);
    puVar4 = (uint8_t *)malloc(rom->size);
    rom->data = puVar4;
    fread(rom->data,1,rom->size,__stream);
    rom_local._4_4_ = fclose(__stream);
  }
  return rom_local._4_4_;
}

Assistant:

int gb_load_rom(GameboyRom* rom, const char* path) {

    FILE* rom_file;
    rom_file = fopen(path, "r");
    if(!rom_file) {
        printf("ERROR\tOpening file\t%s\n", strerror(errno));
        return 1;
    }

    fseek(rom_file, 0, SEEK_END);
    rom->size = ftell(rom_file);
    fseek(rom_file, 0, SEEK_SET);

    rom->data = malloc(rom->size * sizeof(uint8_t));
    fread(rom->data, sizeof(uint8_t), rom->size, rom_file);

    return fclose(rom_file);
}